

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O0

void __thiscall FWallTmapVals::InitFromWallCoords(FWallTmapVals *this,FWallCoords *wallc)

{
  TVector2<float> *local_28;
  FVector2 *right;
  FVector2 *left;
  FWallCoords *wallc_local;
  FWallTmapVals *this_local;
  
  local_28 = &wallc->tright;
  right = &wallc->tleft;
  if ((MirrorFlags & 1) != 0) {
    left = &wallc->tleft;
    wallc_local = (FWallCoords *)this;
    swapvalues<TVector2<float>const*>(&right,&local_28);
  }
  this->UoverZorg = right->X * (float)centerx;
  this->UoverZstep = -right->Y;
  this->InvZorg = (right->X - local_28->X) * (float)centerx;
  this->InvZstep = local_28->Y - right->Y;
  return;
}

Assistant:

void FWallTmapVals::InitFromWallCoords(const FWallCoords *wallc)
{
	const FVector2 *left = &wallc->tleft;
	const FVector2 *right = &wallc->tright;

	if (MirrorFlags & RF_XFLIP)
	{
		swapvalues(left, right);
	}
	UoverZorg = left->X * centerx;
	UoverZstep = -left->Y;
	InvZorg = (left->X - right->X) * centerx;
	InvZstep = right->Y - left->Y;
}